

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O2

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  spki_record *psVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (spki_record *)malloc(0x80);
  psVar2->asn = ASN;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    psVar2->ski[lVar3] = (char)ski_offset + (char)lVar3;
  }
  for (lVar3 = 0; lVar3 != 0x5b; lVar3 = lVar3 + 1) {
    psVar2->spki[lVar3] = (char)spki_offset + (char)lVar3;
  }
  psVar2->socket = (rtr_socket *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski); i++)
		record->ski[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki); i++)
		record->spki[i] = i + spki_offset;

	record->socket = socket;
	return record;
}